

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

bool __thiscall
cmFindLibraryCommand::InitialPass
          (cmFindLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  string *__lhs;
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *suffix;
  cmState *pcVar4;
  string library;
  string notfound;
  
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).VariableDocumentation);
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName);
  iVar3 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand._vptr_cmCommand[7])
                    (this,argsIn);
  bVar1 = SUB41(iVar3,0);
  if (bVar1 == false) {
    return false;
  }
  if ((this->super_cmFindBase).AlreadyInCache == true) {
    if ((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo != true) {
      return bVar1;
    }
    cmMakefile::AddCacheDefinition
              ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,
               &(this->super_cmFindBase).VariableName,"",
               (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
    return bVar1;
  }
  this_00 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&library,"CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX",(allocator<char> *)&notfound)
  ;
  suffix = cmMakefile::GetDefinition(this_00,&library);
  std::__cxx11::string::~string((string *)&library);
  if (suffix == (char *)0x0) {
    bVar2 = cmMakefile::PlatformIs32Bit
                      ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
    if (bVar2) {
      pcVar4 = cmMakefile::GetState
                         ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&library,"FIND_LIBRARY_USE_LIB32_PATHS",(allocator<char> *)&notfound);
      bVar2 = cmState::GetGlobalPropertyAsBool(pcVar4,&library);
      std::__cxx11::string::~string((string *)&library);
      if (bVar2) {
        suffix = "32";
        goto LAB_00249044;
      }
    }
    bVar2 = cmMakefile::PlatformIs64Bit
                      ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
    if (bVar2) {
      pcVar4 = cmMakefile::GetState
                         ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&library,"FIND_LIBRARY_USE_LIB64_PATHS",(allocator<char> *)&notfound);
      bVar2 = cmState::GetGlobalPropertyAsBool(pcVar4,&library);
      std::__cxx11::string::~string((string *)&library);
      if (bVar2) {
        suffix = "64";
        goto LAB_00249044;
      }
    }
    bVar2 = cmMakefile::PlatformIsx32
                      ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
    if (!bVar2) goto LAB_0024904f;
    pcVar4 = cmMakefile::GetState
                       ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&library,"FIND_LIBRARY_USE_LIBX32_PATHS",(allocator<char> *)&notfound);
    bVar2 = cmState::GetGlobalPropertyAsBool(pcVar4,&library);
    std::__cxx11::string::~string((string *)&library);
    if (!bVar2) goto LAB_0024904f;
    suffix = "x32";
  }
LAB_00249044:
  AddArchitecturePaths(this,suffix);
LAB_0024904f:
  FindLibrary_abi_cxx11_(&library,this);
  __lhs = &(this->super_cmFindBase).VariableName;
  if (library._M_string_length == 0) {
    std::operator+(&notfound,__lhs,"-NOTFOUND");
    cmMakefile::AddCacheDefinition
              ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,__lhs,
               notfound._M_dataplus._M_p,
               (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
    std::__cxx11::string::~string((string *)&notfound);
  }
  else {
    cmMakefile::AddCacheDefinition
              ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,__lhs,
               library._M_dataplus._M_p,
               (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
  }
  std::__cxx11::string::~string((string *)&library);
  return bVar1;
}

Assistant:

bool cmFindLibraryCommand::InitialPass(std::vector<std::string> const& argsIn,
                                       cmExecutionStatus&)
{
  this->VariableDocumentation = "Path to a library.";
  this->CMakePathName = "LIBRARY";
  if (!this->ParseArguments(argsIn)) {
    return false;
  }
  if (this->AlreadyInCache) {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->AlreadyInCacheWithoutMetaInfo) {
      this->Makefile->AddCacheDefinition(this->VariableName, "",
                                         this->VariableDocumentation.c_str(),
                                         cmStateEnums::FILEPATH);
    }
    return true;
  }

  // add custom lib<qual> paths instead of using fixed lib32, lib64 or
  // libx32
  if (const char* customLib = this->Makefile->GetDefinition(
        "CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX")) {
    this->AddArchitecturePaths(customLib);
  }
  // add special 32 bit paths if this is a 32 bit compile.
  else if (this->Makefile->PlatformIs32Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB32_PATHS")) {
    this->AddArchitecturePaths("32");
  }
  // add special 64 bit paths if this is a 64 bit compile.
  else if (this->Makefile->PlatformIs64Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB64_PATHS")) {
    this->AddArchitecturePaths("64");
  }
  // add special 32 bit paths if this is an x32 compile.
  else if (this->Makefile->PlatformIsx32() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIBX32_PATHS")) {
    this->AddArchitecturePaths("x32");
  }

  std::string const library = this->FindLibrary();
  if (!library.empty()) {
    // Save the value in the cache
    this->Makefile->AddCacheDefinition(this->VariableName, library.c_str(),
                                       this->VariableDocumentation.c_str(),
                                       cmStateEnums::FILEPATH);
    return true;
  }
  std::string notfound = this->VariableName + "-NOTFOUND";
  this->Makefile->AddCacheDefinition(this->VariableName, notfound.c_str(),
                                     this->VariableDocumentation.c_str(),
                                     cmStateEnums::FILEPATH);
  return true;
}